

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

bool __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::Equals
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this,
          ParamIteratorInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
          *other)

{
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_*,_false>
  _Var1;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
  _Var2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_00;
  GTestLog local_1c;
  
  iVar5 = (*(this->
            super_ParamIteratorInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
            )._vptr_ParamIteratorInterface[2])();
  iVar6 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar3 = IsTrue(CONCAT44(extraout_var,iVar5) == CONCAT44(extraout_var_00,iVar6));
  if (!bVar3) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x371);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition BaseGenerator() == other.BaseGenerator() failed. ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The program attempted to compare iterators ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"from different generators.",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    GTestLog::~GTestLog(&local_1c);
  }
  this_00 = CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<google::protobuf::descriptor_unittest::DescriptorPoolMode,char_const*>::IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>>const,testing::internal::ParamIteratorInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,char_const*>>const>
                      (other);
  bVar3 = AtEnd(this);
  if ((bVar3) && (bVar3 = AtEnd(this_00), bVar3)) {
    return true;
  }
  _Var1._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_testing::internal::ParamIterator<const_char_*>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_*,_false>
       ._M_head_impl;
  if ((_Var1._M_head_impl !=
       ((ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode> *)
       (this_00->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_testing::internal::ParamIterator<const_char_*>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_*,_false>
       )._M_head_impl) &&
     (iVar5 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])(), (char)iVar5 == '\0')) {
    return false;
  }
  _Var2._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_testing::internal::ParamIterator<const_char_*>_>
                 .super__Tuple_impl<1UL,_testing::internal::ParamIterator<const_char_*>_>.
                 super__Head_base<1UL,_testing::internal::ParamIterator<const_char_*>,_false>.
                 _M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
                 ._M_t;
  if ((_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>)
      _Var2._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>.
      _M_head_impl ==
      (_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>)
      *(_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
        *)&(this_00->current_).
           super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_testing::internal::ParamIterator<const_char_*>_>
           .super__Tuple_impl<1UL,_testing::internal::ParamIterator<const_char_*>_>.
           super__Head_base<1UL,_testing::internal::ParamIterator<const_char_*>,_false>._M_head_impl
           .impl_._M_t.
           super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
     ) {
    uVar4 = 1;
  }
  else {
    uVar4 = (**(code **)(*(long *)_Var2._M_t.
                                  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
                                  .
                                  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>
                                  ._M_head_impl + 0x30))();
  }
  return (bool)uVar4;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }